

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O2

void __thiscall
kratos::SystemVerilogCodeGen::stmt_code(SystemVerilogCodeGen *this,ScopedStmtBlock *stmt)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  int iVar3;
  ostream *poVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint64_t i;
  ulong uVar5;
  string_view sVar6;
  string local_50;
  
  if (this->generator_->debug == true) {
    (stmt->super_StmtBlock).super_Stmt.super_IRNode.verilog_ln =
         *(uint32_t *)&(this->stream_).super_stringstream.field_0x90;
  }
  puVar1 = &(this->stream_).super_stringstream.field_0x10;
  poVar4 = std::operator<<((ostream *)puVar1,"begin");
  block_label_abi_cxx11_(&local_50,this,&stmt->super_StmtBlock);
  poVar4 = std::operator<<(poVar4,(string *)&local_50);
  puVar2 = &(this->stream_).super_stringstream.field_0x90;
  *(long *)puVar2 = *(long *)puVar2 + 1;
  std::operator<<(poVar4,'\n');
  std::__cxx11::string::~string((string *)&local_50);
  this->indent_ = this->indent_ + 1;
  uVar5 = 0;
  while( true ) {
    iVar3 = (*(stmt->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[1])(stmt);
    if (CONCAT44(extraout_var,iVar3) <= uVar5) break;
    iVar3 = (*(stmt->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[2])(stmt,uVar5);
    (**this->_vptr_SystemVerilogCodeGen)(this,CONCAT44(extraout_var_00,iVar3));
    uVar5 = uVar5 + 1;
  }
  this->indent_ = this->indent_ - 1;
  sVar6 = indent(this);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar1,sVar6._M_str,sVar6._M_len);
  poVar4 = std::operator<<(poVar4,"end");
  block_label_abi_cxx11_(&local_50,this,&stmt->super_StmtBlock);
  poVar4 = std::operator<<(poVar4,(string *)&local_50);
  puVar1 = &(this->stream_).super_stringstream.field_0x90;
  *(long *)puVar1 = *(long *)puVar1 + 1;
  std::operator<<(poVar4,'\n');
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void SystemVerilogCodeGen::stmt_code(kratos::ScopedStmtBlock* stmt) {
    if (generator_->debug) {
        stmt->verilog_ln = stream_.line_no();
    }

    stream_ << "begin" << block_label(stmt) << stream_.endl();
    indent_++;

    for (uint64_t i = 0; i < stmt->child_count(); i++) {
        dispatch_node(stmt->get_child(i));
    }

    indent_--;
    stream_ << indent() << "end" << block_label(stmt) << stream_.endl();
}